

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O2

BOOL __thiscall
Js::TypedArray<unsigned_char,_false,_false>::BaseTypedDirectSetItemNoSet
          (TypedArray<unsigned_char,_false,_false> *this,uint32 index,Var value,
          _func_uchar_Var_ScriptContext_ptr *convFunc)

{
  (*convFunc)(value,(((((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                        super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr
                     )->super_JavascriptLibraryBase).scriptContext.ptr);
  if (((this->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached != true) {
    return 0;
  }
  JavascriptError::ThrowTypeError
            ((((((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                 super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebe5,(PCWSTR)0x0);
}

Assistant:

inline BOOL BaseTypedDirectSetItemNoSet(__in uint32 index, __in Js::Var value, TypeName (*convFunc)(Var value, ScriptContext* scriptContext))
        {
            // This call can potentially invoke user code, and may end up detaching the underlying array (this).
            // Therefore it was brought out and above the IsDetached check
            convFunc(value, GetScriptContext());

            if (this->IsDetachedBuffer()) // 9.4.5.9 IntegerIndexedElementSet
            {
                JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_DetachedTypedArray);
            }

            return FALSE;
        }